

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  byte *pbVar1;
  byte *pbVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  int *piVar13;
  ulong uVar14;
  int *piVar15;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:294:15)>
  __cmp;
  int *piVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  _DistanceType __len;
  int *piVar22;
  ulong uVar23;
  int *piVar24;
  bool bVar25;
  uchar offsets_l_storage [128];
  int *local_1b8;
  long local_1b0;
  byte local_101 [128];
  byte local_81 [81];
  
  do {
    lVar17 = (long)end._M_current - (long)begin._M_current;
    uVar11 = lVar17 >> 2;
    if ((long)uVar11 < 0x18) {
      bVar25 = true;
      if ((leftmost & 1U) == 0) {
        if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
          pdVar7 = (comp.this)->vals;
          _Var12._M_current = begin._M_current;
          piVar16 = begin._M_current + 1;
          do {
            iVar5 = _Var12._M_current[1];
            dVar3 = pdVar7[iVar5];
            piVar15 = piVar16;
            if (pdVar7[*_Var12._M_current] <= dVar3 && dVar3 != pdVar7[*_Var12._M_current]) {
              do {
                *piVar15 = piVar15[-1];
                piVar24 = piVar15 + -2;
                piVar15 = piVar15 + -1;
              } while (pdVar7[*piVar24] <= dVar3 && dVar3 != pdVar7[*piVar24]);
              *piVar15 = iVar5;
            }
            piVar15 = piVar16 + 1;
            _Var12._M_current = piVar16;
            piVar16 = piVar15;
          } while (piVar15 != end._M_current);
        }
      }
      else if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
        pdVar7 = (comp.this)->vals;
        lVar17 = 4;
        _Var12._M_current = begin._M_current;
        piVar16 = begin._M_current + 1;
        do {
          iVar5 = _Var12._M_current[1];
          dVar3 = pdVar7[iVar5];
          lVar18 = lVar17;
          if (pdVar7[*_Var12._M_current] <= dVar3 && dVar3 != pdVar7[*_Var12._M_current]) {
            do {
              *(undefined4 *)((long)begin._M_current + lVar18) =
                   *(undefined4 *)((long)begin._M_current + lVar18 + -4);
              _Var12._M_current = begin._M_current;
              if (lVar18 == 4) goto LAB_0028c26b;
              lVar20 = lVar18 + -8;
              lVar18 = lVar18 + -4;
            } while (pdVar7[*(begin._M_current + lVar20)] <= dVar3 &&
                     dVar3 != pdVar7[*(begin._M_current + lVar20)]);
            _Var12._M_current = lVar18 + begin._M_current;
LAB_0028c26b:
            *_Var12._M_current = iVar5;
          }
          piVar15 = piVar16 + 1;
          lVar17 = lVar17 + 4;
          _Var12._M_current = piVar16;
          piVar16 = piVar15;
        } while (piVar15 != end._M_current);
      }
    }
    else {
      uVar9 = uVar11 >> 1;
      if ((long)uVar11 < 0x81) {
        iVar5 = begin._M_current[uVar9];
        pdVar7 = (comp.this)->vals;
        if (pdVar7[iVar5] <= pdVar7[*begin._M_current] && pdVar7[*begin._M_current] != pdVar7[iVar5]
           ) {
          begin._M_current[uVar9] = *begin._M_current;
          *begin._M_current = iVar5;
        }
        iVar5 = *begin._M_current;
        if (pdVar7[iVar5] <= pdVar7[end._M_current[-1]] &&
            pdVar7[end._M_current[-1]] != pdVar7[iVar5]) {
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = iVar5;
        }
        iVar5 = begin._M_current[uVar9];
        if (pdVar7[iVar5] <= pdVar7[*begin._M_current] && pdVar7[*begin._M_current] != pdVar7[iVar5]
           ) {
          begin._M_current[uVar9] = *begin._M_current;
          *begin._M_current = iVar5;
        }
      }
      else {
        iVar5 = *begin._M_current;
        pdVar7 = (comp.this)->vals;
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9]] &&
            pdVar7[begin._M_current[uVar9]] != pdVar7[iVar5]) {
          *begin._M_current = begin._M_current[uVar9];
          begin._M_current[uVar9] = iVar5;
        }
        iVar5 = begin._M_current[uVar9];
        if (pdVar7[iVar5] <= pdVar7[end._M_current[-1]] &&
            pdVar7[end._M_current[-1]] != pdVar7[iVar5]) {
          begin._M_current[uVar9] = end._M_current[-1];
          end._M_current[-1] = iVar5;
        }
        iVar5 = *begin._M_current;
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9]] &&
            pdVar7[begin._M_current[uVar9]] != pdVar7[iVar5]) {
          *begin._M_current = begin._M_current[uVar9];
          begin._M_current[uVar9] = iVar5;
        }
        iVar5 = begin._M_current[1];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9 - 1]] &&
            pdVar7[begin._M_current[uVar9 - 1]] != pdVar7[iVar5]) {
          begin._M_current[1] = begin._M_current[uVar9 - 1];
          begin._M_current[uVar9 - 1] = iVar5;
        }
        iVar5 = begin._M_current[uVar9 - 1];
        if (pdVar7[iVar5] <= pdVar7[end._M_current[-2]] &&
            pdVar7[end._M_current[-2]] != pdVar7[iVar5]) {
          begin._M_current[uVar9 - 1] = end._M_current[-2];
          end._M_current[-2] = iVar5;
        }
        iVar5 = begin._M_current[1];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9 - 1]] &&
            pdVar7[begin._M_current[uVar9 - 1]] != pdVar7[iVar5]) {
          begin._M_current[1] = begin._M_current[uVar9 - 1];
          begin._M_current[uVar9 - 1] = iVar5;
        }
        iVar5 = begin._M_current[2];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9 + 1]] &&
            pdVar7[begin._M_current[uVar9 + 1]] != pdVar7[iVar5]) {
          begin._M_current[2] = begin._M_current[uVar9 + 1];
          begin._M_current[uVar9 + 1] = iVar5;
        }
        iVar5 = begin._M_current[uVar9 + 1];
        if (pdVar7[iVar5] <= pdVar7[end._M_current[-3]] &&
            pdVar7[end._M_current[-3]] != pdVar7[iVar5]) {
          begin._M_current[uVar9 + 1] = end._M_current[-3];
          end._M_current[-3] = iVar5;
        }
        iVar5 = begin._M_current[2];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9 + 1]] &&
            pdVar7[begin._M_current[uVar9 + 1]] != pdVar7[iVar5]) {
          begin._M_current[2] = begin._M_current[uVar9 + 1];
          begin._M_current[uVar9 + 1] = iVar5;
        }
        iVar5 = begin._M_current[uVar9 - 1];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9]] &&
            pdVar7[begin._M_current[uVar9]] != pdVar7[iVar5]) {
          begin._M_current[uVar9 - 1] = begin._M_current[uVar9];
          begin._M_current[uVar9] = iVar5;
        }
        iVar5 = begin._M_current[uVar9];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9 + 1]] &&
            pdVar7[begin._M_current[uVar9 + 1]] != pdVar7[iVar5]) {
          begin._M_current[uVar9] = begin._M_current[uVar9 + 1];
          begin._M_current[uVar9 + 1] = iVar5;
        }
        iVar5 = begin._M_current[uVar9 - 1];
        if (pdVar7[iVar5] <= pdVar7[begin._M_current[uVar9]] &&
            pdVar7[begin._M_current[uVar9]] != pdVar7[iVar5]) {
          begin._M_current[uVar9 - 1] = begin._M_current[uVar9];
          begin._M_current[uVar9] = iVar5;
        }
        iVar5 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar9];
        begin._M_current[uVar9] = iVar5;
      }
      if ((leftmost & 1U) == 0) {
        iVar5 = *begin._M_current;
        pdVar7 = (comp.this)->vals;
        dVar3 = pdVar7[iVar5];
        if (pdVar7[begin._M_current[-1]] <= dVar3) {
          lVar17 = 0;
          do {
            lVar18 = lVar17 + -4;
            lVar17 = lVar17 + -4;
          } while (pdVar7[*(end._M_current + lVar18)] <= dVar3 &&
                   dVar3 != pdVar7[*(end._M_current + lVar18)]);
          piVar16 = end._M_current + lVar17;
          _Var12._M_current = begin._M_current;
          if (lVar17 == -4) {
            do {
              if (piVar16 <= _Var12._M_current) break;
              piVar15 = _Var12._M_current + 1;
              _Var12._M_current = _Var12._M_current + 1;
            } while (dVar3 < pdVar7[*piVar15] || dVar3 == pdVar7[*piVar15]);
          }
          else {
            do {
              piVar15 = _Var12._M_current + 1;
              _Var12._M_current = _Var12._M_current + 1;
            } while (dVar3 < pdVar7[*piVar15] || dVar3 == pdVar7[*piVar15]);
          }
          while (_Var12._M_current < piVar16) {
            iVar6 = *_Var12._M_current;
            *_Var12._M_current = *piVar16;
            *piVar16 = iVar6;
            do {
              piVar15 = piVar16 + -1;
              piVar16 = piVar16 + -1;
            } while (pdVar7[*piVar15] <= dVar3 && dVar3 != pdVar7[*piVar15]);
            do {
              piVar15 = _Var12._M_current + 1;
              _Var12._M_current = _Var12._M_current + 1;
            } while (dVar3 < pdVar7[*piVar15] || dVar3 == pdVar7[*piVar15]);
          }
          *begin._M_current = *piVar16;
          *piVar16 = iVar5;
          bVar25 = false;
          begin._M_current = piVar16 + 1;
          goto LAB_0028cfa2;
        }
      }
      iVar5 = *begin._M_current;
      pdVar7 = (comp.this)->vals;
      dVar3 = pdVar7[iVar5];
      lVar18 = 0;
      do {
        iVar6 = *(begin._M_current + lVar18 + 4);
        lVar18 = lVar18 + 4;
      } while (dVar3 < pdVar7[iVar6]);
      piVar16 = begin._M_current + lVar18;
      _Var12._M_current = end._M_current;
      if (lVar18 == 4) {
        do {
          if (_Var12._M_current <= piVar16) break;
          piVar15 = _Var12._M_current + -1;
          _Var12._M_current = _Var12._M_current + -1;
        } while (pdVar7[*piVar15] <= dVar3);
      }
      else {
        do {
          piVar15 = _Var12._M_current + -1;
          _Var12._M_current = _Var12._M_current + -1;
        } while (pdVar7[*piVar15] <= dVar3);
      }
      piVar15 = piVar16;
      if (piVar16 < _Var12._M_current) {
        piVar15 = begin._M_current + lVar18 + 1;
        *(begin._M_current + lVar18) = *_Var12._M_current;
        *_Var12._M_current = iVar6;
        piVar21 = _Var12._M_current;
        piVar24 = piVar15;
        local_1b8 = _Var12._M_current;
        if (piVar15 < _Var12._M_current) {
          local_1b0 = 0;
          uVar10 = 0;
          uVar9 = 0;
          lVar18 = 0;
          do {
            uVar19 = (long)piVar21 - (long)piVar15 >> 2;
            uVar14 = uVar19 >> (uVar10 == 0);
            if (uVar9 != 0) {
              uVar14 = 0;
            }
            uVar19 = uVar19 - uVar14;
            if (uVar10 != 0) {
              uVar19 = 0;
            }
            if (uVar14 < 0x40) {
              uVar23 = uVar9;
              if (uVar14 != 0) {
                uVar9 = 0;
                do {
                  local_81[uVar23 + 1] = (byte)uVar9;
                  dVar3 = (comp.this)->vals[*piVar15];
                  pdVar7 = (comp.this)->vals + iVar5;
                  uVar9 = uVar9 + 1;
                  uVar23 = uVar23 + (dVar3 < *pdVar7 || dVar3 == *pdVar7);
                  piVar15 = piVar15 + 1;
                } while (uVar14 != uVar9);
              }
            }
            else {
              piVar22 = piVar15;
              uVar14 = 0xfffffffffffffff8;
              do {
                piVar13 = piVar22;
                uVar23 = uVar14 + 8;
                local_81[uVar9 + 1] = (byte)uVar23;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 8]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (dVar3 < *pdVar7 || dVar3 == *pdVar7) + uVar9;
                cVar8 = (char)uVar14;
                local_81[lVar20 + 1] = cVar8 + 9;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 9]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                local_81[lVar20 + 1] = cVar8 + 10;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 10]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                local_81[lVar20 + 1] = cVar8 + 0xb;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 0xb]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                local_81[lVar20 + 1] = cVar8 + 0xc;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 0xc]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                local_81[lVar20 + 1] = cVar8 + 0xd;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 0xd]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                local_81[lVar20 + 1] = cVar8 + 0xe;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 0xe]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                local_81[lVar20 + 1] = cVar8 + 0xf;
                dVar3 = (comp.this)->vals[piVar15[uVar14 + 0xf]];
                pdVar7 = (comp.this)->vals + iVar5;
                uVar9 = (ulong)(dVar3 < *pdVar7 || dVar3 == *pdVar7) + lVar20;
                piVar22 = piVar15 + uVar14 + 0x10;
                uVar14 = uVar23;
              } while (uVar23 < 0x38);
              piVar15 = piVar13 + 8;
              uVar23 = uVar9;
            }
            if (uVar19 < 0x40) {
              if (uVar19 != 0) {
                uVar9 = 0;
                do {
                  uVar9 = uVar9 + 1;
                  local_101[uVar10 + 1] = (byte)uVar9;
                  piVar22 = piVar21 + -1;
                  piVar21 = piVar21 + -1;
                  dVar3 = (comp.this)->vals[*piVar22];
                  pdVar7 = (comp.this)->vals + iVar5;
                  uVar10 = uVar10 + (*pdVar7 <= dVar3 && dVar3 != *pdVar7);
                } while (uVar19 != uVar9);
              }
            }
            else {
              uVar9 = 0xfffffffffffffff8;
              do {
                cVar8 = (char)uVar9;
                local_101[uVar10 + 1] = cVar8 + 9;
                dVar3 = (comp.this)->vals[piVar21[-1]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (*pdVar7 <= dVar3 && dVar3 != *pdVar7) + uVar10;
                local_101[lVar20 + 1] = cVar8 + 10;
                dVar3 = (comp.this)->vals[piVar21[-2]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                local_101[lVar20 + 1] = cVar8 + 0xb;
                dVar3 = (comp.this)->vals[piVar21[-3]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                local_101[lVar20 + 1] = cVar8 + 0xc;
                dVar3 = (comp.this)->vals[piVar21[-4]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                local_101[lVar20 + 1] = cVar8 + 0xd;
                dVar3 = (comp.this)->vals[piVar21[-5]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                local_101[lVar20 + 1] = cVar8 + 0xe;
                dVar3 = (comp.this)->vals[piVar21[-6]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                local_101[lVar20 + 1] = cVar8 + 0xf;
                dVar3 = (comp.this)->vals[piVar21[-7]];
                pdVar7 = (comp.this)->vals + iVar5;
                lVar20 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                local_101[lVar20 + 1] = cVar8 + 0x10;
                piVar22 = piVar21 + -8;
                piVar21 = piVar21 + -8;
                dVar3 = (comp.this)->vals[*piVar22];
                pdVar7 = (comp.this)->vals + iVar5;
                uVar10 = (ulong)(*pdVar7 <= dVar3 && dVar3 != *pdVar7) + lVar20;
                uVar9 = uVar9 + 8;
              } while (uVar9 < 0x38);
            }
            uVar14 = uVar23;
            if (uVar10 < uVar23) {
              uVar14 = uVar10;
            }
            pbVar1 = local_81 + local_1b0 + 1;
            pbVar2 = local_101 + lVar18 + 1;
            if (uVar23 == uVar10) {
              if (uVar14 != 0) {
                uVar9 = 0;
                do {
                  bVar4 = pbVar2[uVar9];
                  iVar6 = piVar24[pbVar1[uVar9]];
                  piVar24[pbVar1[uVar9]] = local_1b8[-(ulong)bVar4];
                  local_1b8[-(ulong)bVar4] = iVar6;
                  uVar9 = uVar9 + 1;
                } while (uVar14 != uVar9);
              }
            }
            else if (uVar14 != 0) {
              piVar22 = local_1b8 + -(ulong)*pbVar2;
              iVar6 = piVar24[*pbVar1];
              piVar24[*pbVar1] = *piVar22;
              if (uVar14 != 1) {
                uVar9 = 1;
                do {
                  bVar4 = pbVar1[uVar9];
                  *piVar22 = piVar24[bVar4];
                  piVar22 = local_1b8 + -(ulong)pbVar2[uVar9];
                  piVar24[bVar4] = *piVar22;
                  uVar9 = uVar9 + 1;
                } while (uVar14 != uVar9);
              }
              *piVar22 = iVar6;
            }
            uVar9 = uVar23 - uVar14;
            local_1b0 = local_1b0 + uVar14;
            lVar18 = lVar18 + uVar14;
            if (uVar23 <= uVar10) {
              local_1b0 = 0;
              piVar24 = piVar15;
            }
            uVar10 = uVar10 - uVar14;
            if (uVar10 == 0) {
              lVar18 = 0;
              local_1b8 = piVar21;
            }
          } while (piVar15 < piVar21);
        }
        else {
          uVar9 = 0;
          uVar10 = 0;
          lVar18 = 0;
          local_1b0 = 0;
        }
        for (; uVar9 != 0; uVar9 = uVar9 - 1) {
          piVar15 = piVar21 + -1;
          iVar6 = piVar24[local_81[uVar9 + local_1b0]];
          piVar24[local_81[uVar9 + local_1b0]] = piVar21[-1];
          piVar21[-1] = iVar6;
          piVar21 = piVar15;
        }
        for (; uVar10 != 0; uVar10 = uVar10 - 1) {
          iVar6 = local_1b8[-(ulong)local_101[uVar10 + lVar18]];
          local_1b8[-(ulong)local_101[uVar10 + lVar18]] = *piVar15;
          *piVar15 = iVar6;
          piVar15 = piVar15 + 1;
        }
      }
      end_00._M_current = piVar15 + -1;
      *begin._M_current = piVar15[-1];
      piVar15[-1] = iVar5;
      uVar10 = (long)end_00._M_current - (long)begin._M_current >> 2;
      uVar9 = (long)end._M_current - (long)piVar15 >> 2;
      if (((long)uVar10 < (long)(uVar11 >> 3)) || ((long)uVar9 < (long)(uVar11 >> 3))) {
        bad_allowed = bad_allowed + -1;
        if (bad_allowed == 0) {
          lVar18 = (long)((uVar11 - ((long)(uVar11 - 2) >> 0x3f)) + -2) >> 1;
          do {
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::separateLiftedMixedIntegerCover()::__0>>
                      (begin,lVar18,uVar11,begin._M_current[lVar18],
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:294:15)>
                        )comp.this);
            bVar25 = lVar18 != 0;
            lVar18 = lVar18 + -1;
          } while (bVar25);
          bVar25 = true;
          piVar16 = end._M_current + -1;
          if (lVar17 < 5) {
            bad_allowed = 0;
          }
          else {
            do {
              iVar5 = *piVar16;
              *piVar16 = *begin._M_current;
              lVar17 = lVar17 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::separateLiftedMixedIntegerCover()::__0>>
                        (begin,0,lVar17 >> 2,iVar5,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:294:15)>
                          )comp.this);
              piVar16 = piVar16 + -1;
            } while (4 < lVar17);
            bad_allowed = 0;
            bVar25 = true;
          }
          goto LAB_0028cfa2;
        }
        if (0x17 < (long)uVar10) {
          iVar5 = *begin._M_current;
          uVar11 = uVar10 & 0xfffffffffffffffc;
          *begin._M_current = *(begin._M_current + uVar11);
          *(begin._M_current + uVar11) = iVar5;
          iVar5 = piVar15[-2];
          piVar15[-2] = *(int *)((long)piVar15 + (-4 - uVar11));
          *(int *)((long)piVar15 + (-4 - uVar11)) = iVar5;
          if (0x80 < (long)uVar10) {
            uVar10 = uVar10 >> 2;
            iVar5 = begin._M_current[1];
            begin._M_current[1] = begin._M_current[uVar10 + 1];
            begin._M_current[uVar10 + 1] = iVar5;
            iVar5 = begin._M_current[2];
            begin._M_current[2] = begin._M_current[uVar10 + 2];
            begin._M_current[uVar10 + 2] = iVar5;
            iVar5 = piVar15[-3];
            piVar15[-3] = piVar15[~uVar10 - 1];
            piVar15[~uVar10 - 1] = iVar5;
            iVar5 = piVar15[-4];
            piVar15[-4] = piVar15[-uVar10 + -3];
            piVar15[-uVar10 + -3] = iVar5;
          }
        }
        if (0x17 < (long)uVar9) {
          uVar11 = uVar9 & 0xfffffffffffffffc;
          iVar5 = *piVar15;
          *piVar15 = *(int *)((long)piVar15 + uVar11);
          *(int *)((long)piVar15 + uVar11) = iVar5;
          iVar5 = end._M_current[-1];
          end._M_current[-1] = *(end._M_current - uVar11);
          *(end._M_current - uVar11) = iVar5;
          if (0x80 < (long)uVar9) {
            uVar9 = uVar9 >> 2;
            iVar5 = piVar15[1];
            piVar15[1] = piVar15[uVar9 + 1];
            piVar15[uVar9 + 1] = iVar5;
            iVar5 = piVar15[2];
            piVar15[2] = piVar15[uVar9 + 2];
            piVar15[uVar9 + 2] = iVar5;
            iVar5 = end._M_current[-2];
            end._M_current[-2] = end._M_current[~uVar9];
            end._M_current[~uVar9] = iVar5;
            iVar5 = end._M_current[-3];
            end._M_current[-3] = end._M_current[-2 - uVar9];
            end._M_current[-2 - uVar9] = iVar5;
          }
        }
      }
      else if (_Var12._M_current <= piVar16) {
        if (begin._M_current == end_00._M_current) {
LAB_0028ce83:
          bVar25 = true;
          if (piVar15 == end._M_current) goto LAB_0028cfa2;
          lVar17 = 4;
          uVar11 = 0;
          piVar16 = piVar15;
          do {
            piVar24 = piVar16 + 1;
            if (piVar24 == end._M_current) goto LAB_0028cfa2;
            iVar5 = piVar16[1];
            pdVar7 = (comp.this)->vals;
            dVar3 = pdVar7[iVar5];
            lVar18 = lVar17;
            if (pdVar7[*piVar16] <= dVar3 && dVar3 != pdVar7[*piVar16]) {
              do {
                *(undefined4 *)((long)piVar15 + lVar18) =
                     *(undefined4 *)((long)piVar15 + lVar18 + -4);
                piVar16 = piVar15;
                if (lVar18 == 4) goto LAB_0028ceed;
                lVar20 = lVar18 + -8;
                lVar18 = lVar18 + -4;
              } while (pdVar7[*(int *)((long)piVar15 + lVar20)] <= dVar3 &&
                       dVar3 != pdVar7[*(int *)((long)piVar15 + lVar20)]);
              piVar16 = (int *)(lVar18 + (long)piVar15);
LAB_0028ceed:
              *piVar16 = iVar5;
              uVar11 = uVar11 + ((long)piVar24 - (long)piVar16 >> 2);
            }
            lVar17 = lVar17 + 4;
            piVar16 = piVar24;
          } while (uVar11 < 9);
        }
        else {
          lVar17 = 4;
          uVar11 = 0;
          _Var12._M_current = begin._M_current;
          do {
            piVar16 = _Var12._M_current + 1;
            if (piVar16 == end_00._M_current) goto LAB_0028ce83;
            iVar5 = _Var12._M_current[1];
            pdVar7 = (comp.this)->vals;
            dVar3 = pdVar7[iVar5];
            lVar18 = lVar17;
            if (pdVar7[*_Var12._M_current] <= dVar3 && dVar3 != pdVar7[*_Var12._M_current]) {
              do {
                *(undefined4 *)((long)begin._M_current + lVar18) =
                     *(undefined4 *)((long)begin._M_current + lVar18 + -4);
                _Var12._M_current = begin._M_current;
                if (lVar18 == 4) goto LAB_0028cc57;
                lVar20 = lVar18 + -8;
                lVar18 = lVar18 + -4;
              } while (pdVar7[*(begin._M_current + lVar20)] <= dVar3 &&
                       dVar3 != pdVar7[*(begin._M_current + lVar20)]);
              _Var12._M_current = lVar18 + begin._M_current;
LAB_0028cc57:
              *_Var12._M_current = iVar5;
              uVar11 = uVar11 + ((long)piVar16 - (long)_Var12._M_current >> 2);
            }
            lVar17 = lVar17 + 4;
            _Var12._M_current = piVar16;
          } while (uVar11 < 9);
        }
      }
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
                (begin,end_00,comp,bad_allowed,(bool)(leftmost & 1));
      bVar25 = false;
      leftmost = false;
      begin._M_current = piVar15;
    }
LAB_0028cfa2:
    if (bVar25) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }